

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports-runtime.cpp
# Opt level: O1

void __thiscall
rtosc::helpers::Capture::replyArray(Capture *this,char *param_1,char *args,rtosc_arg_t *vals)

{
  char *pcVar1;
  rtosc_arg_val_t *prVar2;
  uint8_t *puVar3;
  long lVar4;
  char *ptr;
  char cVar5;
  long lVar6;
  
  cVar5 = *args;
  if (cVar5 == '\0') {
    lVar4 = 0;
  }
  else {
    lVar6 = 8;
    lVar4 = 0;
    do {
      prVar2 = this->arg_vals;
      *(char *)((long)prVar2 + lVar6 + -8) = cVar5;
      puVar3 = (vals->b).data;
      pcVar1 = &prVar2->type + lVar6;
      *(double *)pcVar1 = vals->d;
      ((rtosc_arg_t *)(pcVar1 + 8))->d = (double)puVar3;
      cVar5 = args[lVar4 + 1];
      lVar4 = lVar4 + 1;
      lVar6 = lVar6 + 0x18;
      vals = vals + 1;
    } while (cVar5 != '\0');
  }
  this->nargs = (int)lVar4;
  map_blobs(this);
  return;
}

Assistant:

void replyArray(const char*, const char *args,
                    rtosc_arg_t *vals) override
    {
        size_t cur_idx = 0;
        for(const char* ptr = args; *ptr; ++ptr, ++cur_idx)
        {
            assert(cur_idx < max_args);
            arg_vals[cur_idx].type = *ptr;
            arg_vals[cur_idx].val  = vals[cur_idx];
        }
        nargs = cur_idx;
        map_blobs();
    }